

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O1

void __thiscall Guild::SetMemberRank(Guild *this,string *name,int rank)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  size_t __n;
  int iVar4;
  ulong uVar5;
  _List_node_base *p_Var6;
  long *plVar7;
  bool bVar8;
  string rank_str;
  shared_ptr<Guild_Member> member;
  long *local_b8 [2];
  long local_a8 [2];
  ulong local_98;
  World *local_90;
  _List_node_base *local_88;
  undefined1 local_80 [16];
  GuildManager *local_70;
  undefined1 local_60 [16];
  Database_Result local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_70 = (GuildManager *)local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
  GetMember((Guild *)local_80,(string *)this);
  if (local_70 != (GuildManager *)local_60) {
    operator_delete(local_70,local_60._0_8_ + 1);
  }
  if ((element_type *)local_80._0_8_ != (element_type *)0x0) {
    uVar5 = 0;
    if (0 < (int)(rank - 1U)) {
      uVar5 = (ulong)(rank - 1U);
    }
    local_b8[0] = local_a8;
    pcVar1 = (this->ranks)._M_elems[uVar5]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,pcVar1,pcVar1 + (this->ranks)._M_elems[uVar5]._M_string_length);
    *(int *)&((string *)(local_80._0_8_ + 0x18))->_M_string_length = rank;
    local_98 = (ulong)(uint)rank;
    std::__cxx11::string::_M_assign
              ((string *)(((string *)(local_80._0_8_ + 0x18))->field_2)._M_local_buf);
    local_90 = this->manager->world;
    p_Var6 = (_List_node_base *)&(local_90->server->super_Server).clients;
    local_88 = p_Var6;
    do {
      p_Var6 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var6->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
      if (p_Var6 == local_88) {
        Database::Query((Database_Result *)(local_60 + 0x10),&local_90->db,
                        "UPDATE `characters` SET `guild_rank` = #, `guild_rank_string` = \'$\' WHERE `name` = \'$\'"
                        ,local_98,local_b8[0],(name->_M_dataplus)._M_p);
        std::
        vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
        ::~vector((vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                   *)(local_60 + 0x10));
        break;
      }
      lVar2 = *(long *)((long)p_Var6[1]._M_next + 0x108);
      if (lVar2 == 0) {
LAB_001843cf:
        iVar4 = 0;
      }
      else {
        plVar3 = *(long **)(lVar2 + 0x58);
        for (plVar7 = *(long **)(lVar2 + 0x50); plVar7 != plVar3; plVar7 = plVar7 + 1) {
          lVar2 = *plVar7;
          __n = *(size_t *)(lVar2 + 0x20);
          bVar8 = false;
          if (__n == name->_M_string_length) {
            if (__n == 0) {
              bVar8 = true;
            }
            else {
              iVar4 = bcmp(*(void **)(lVar2 + 0x18),(name->_M_dataplus)._M_p,__n);
              bVar8 = iVar4 == 0;
            }
          }
          if (bVar8) {
            *(char *)(lVar2 + 0x408) = (char)local_98;
            std::__cxx11::string::_M_assign((string *)(lVar2 + 0x410));
            iVar4 = (*(byte *)(lVar2 + 0xc) ^ 1) * 3 + 1;
            goto LAB_001843c9;
          }
        }
        iVar4 = 4;
LAB_001843c9:
        if (iVar4 == 4) goto LAB_001843cf;
      }
    } while (iVar4 == 0);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  return;
}

Assistant:

void Guild::SetMemberRank(std::string name, int rank)
{
	std::shared_ptr<Guild_Member> member = this->GetMember(name);

	if (member)
	{
		std::string rank_str = this->GetRank(rank);

		member->rank = rank;
		member->rank_string = rank_str;

		World* world = this->manager->world;

		UTIL_FOREACH(world->server->clients, client)
		{
			EOClient *eoclient = static_cast<EOClient *>(client);

			if (eoclient->player)
			{
				UTIL_FOREACH(eoclient->player->characters, character)
				{
					if (character->real_name == name)
					{
						character->guild_rank = rank;
						character->guild_rank_string = rank_str;
						
						if (character->online)
							return;
						else
							break;
					}
				}
			}
		}

		world->db.Query("UPDATE `characters` SET `guild_rank` = #, `guild_rank_string` = '$' WHERE `name` = '$'",
			rank, rank_str.c_str(), name.c_str());
	}
}